

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ClampedReLULayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_clampedrelu(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x5b4) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5b4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ClampedReLULayerParams::ClampedReLULayerParams(this_00.clampedrelu_);
    (this->layer_).clampedrelu_ = (ClampedReLULayerParams *)this_00;
  }
  return (ClampedReLULayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ClampedReLULayerParams* NeuralNetworkLayer::mutable_clampedrelu() {
  if (!has_clampedrelu()) {
    clear_layer();
    set_has_clampedrelu();
    layer_.clampedrelu_ = new ::CoreML::Specification::ClampedReLULayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.clampedReLU)
  return layer_.clampedrelu_;
}